

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspAppBase::writeNonHcfs(ClaspAppBase *this,PrgDepGraph *graph)

{
  pointer ppNVar1;
  size_type sVar2;
  SharedContext *this_00;
  Solver *pSVar3;
  uint32 numCons;
  int __fd;
  char *__rhs;
  undefined4 extraout_var;
  pointer __n;
  pointer __n_00;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *__buf_00;
  void *extraout_RDX_01;
  uint uVar5;
  uint32 i;
  size_type sVar7;
  pointer ppNVar8;
  WriteCnf cnf;
  StringBuilder buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  WriteCnf local_88;
  StringBuilder local_70;
  ulong uVar4;
  ulong uVar6;
  
  Potassco::StringBuilder::StringBuilder(&local_70);
  __n = (graph->components_).ebo_.buf;
  ppNVar1 = __n + (graph->components_).ebo_.size;
  for (ppNVar8 = __n; ppNVar8 != ppNVar1; ppNVar8 = ppNVar8 + 1) {
    Potassco::StringBuilder::appendFormat(&local_70,".%u",(ulong)(*ppNVar8)->id_);
    __rhs = Potassco::StringBuilder::c_str(&local_70);
    std::operator+(&local_a8,&(this->claspAppOpts_).hccOut,__rhs);
    WriteCnf::WriteCnf(&local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = (*ppNVar8)->prg_;
    sVar2 = (this_00->varInfo_).ebo_.size;
    numCons = SharedContext::numConstraints(this_00);
    WriteCnf::writeHeader(&local_88,sVar2 - 1,numCons);
    uVar5 = (this_00->varInfo_).ebo_.size - 1;
    uVar6 = (ulong)uVar5;
    WriteCnf::write(&local_88,uVar5,&this_00->btig_,(size_t)__n);
    pSVar3 = *(this_00->solvers_).ebo_.buf;
    __buf_00 = extraout_RDX;
    for (uVar5 = 0; uVar5 != (pSVar3->constraints_).ebo_.size; uVar5 = uVar5 + 1) {
      __n = (pointer)(ulong)uVar5;
      __fd = (*(pSVar3->constraints_).ebo_.buf[(long)__n]->_vptr_Constraint[9])();
      uVar4 = CONCAT44(extraout_var,__fd);
      __buf_00 = __buf;
      if (uVar4 != 0) {
        WriteCnf::write(&local_88,__fd,__buf,(size_t)__n);
        __buf_00 = extraout_RDX_00;
        uVar6 = uVar4;
      }
    }
    __n_00 = (pointer)0x0;
    while( true ) {
      pSVar3 = *(this_00->solvers_).ebo_.buf;
      sVar7 = (size_type)__n_00;
      if (sVar7 == (pSVar3->assign_).trail.ebo_.size) break;
      uVar5 = (pSVar3->assign_).trail.ebo_.buf[(long)__n_00].rep_;
      uVar6 = (ulong)uVar5;
      WriteCnf::write(&local_88,uVar5,__buf_00,(size_t)__n_00);
      __n = __n_00;
      __buf_00 = extraout_RDX_01;
      __n_00 = (pointer)(ulong)(sVar7 + 1);
    }
    WriteCnf::close(&local_88,(int)uVar6);
    Potassco::StringBuilder::clear(&local_70);
    WriteCnf::~WriteCnf(&local_88);
  }
  Potassco::StringBuilder::~StringBuilder(&local_70);
  return;
}

Assistant:

void ClaspAppBase::writeNonHcfs(const PrgDepGraph& graph) const {
	Potassco::StringBuilder buf;
	for (PrgDepGraph::NonHcfIter it = graph.nonHcfBegin(), end = graph.nonHcfEnd(); it != end; ++it) {
		buf.appendFormat(".%u", (*it)->id());
		WriteCnf cnf(claspAppOpts_.hccOut + buf.c_str());
		const SharedContext& ctx = (*it)->ctx();
		cnf.writeHeader(ctx.numVars(), ctx.numConstraints());
		cnf.write(ctx.numVars(), ctx.shortImplications());
		Solver::DBRef db = ctx.master()->constraints();
		for (uint32 i = 0; i != db.size(); ++i) {
			if (ClauseHead* x = db[i]->clause()) { cnf.write(x); }
		}
		for (uint32 i = 0; i != ctx.master()->trail().size(); ++i) {
			cnf.write(ctx.master()->trail()[i]);
		}
		cnf.close();
		buf.clear();
	}
}